

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  long lVar1;
  int iVar2;
  int object;
  long lVar3;
  long *plVar4;
  TPZGeoEl *pTVar5;
  long *plVar6;
  long lVar7;
  int order;
  TPZManVector<int,_3> orderdim;
  TPZStack<int,_10> ordervec;
  int local_ac;
  TPZManVector<int,_3> local_a8;
  TPZManVector<int,_10> local_78;
  
  if ((this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
               ,0x44c);
  }
  lVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if (lVar3 != 0) {
    plVar4 = (long *)__dynamic_cast(lVar3,&TPZMaterial::typeinfo,&TPZMatCombinedSpaces::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar4 != (long *)0x0) {
      lVar3 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      pTVar5 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar2 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
      if (0 < lVar3) {
        lVar7 = 0;
        do {
          if ((*(int *)((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.
                              super_TPZVec<int>.fStore + lVar7) != 0) &&
             (lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl
                               + lVar7 * 4), lVar1 != 0)) {
            plVar6 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
            if (plVar6 != (long *)0x0) {
              object = (**(code **)(*plVar6 + 0x268))(plVar6);
              TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,object);
            }
          }
          lVar7 = lVar7 + 4;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      local_ac = (**(code **)(*plVar4 + 0x48))(plVar4,&local_78);
      TPZManVector<int,_3>::TPZManVector(&local_a8,(long)iVar2,&local_ac);
      TPZInt1d::SetOrder(&this->fIntRule,&local_a8.super_TPZVec<int>,0);
      if (local_a8.super_TPZVec<int>.fStore != local_a8.fExtAlloc) {
        local_a8.super_TPZVec<int>.fNAlloc = 0;
        local_a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (local_a8.super_TPZVec<int>.fStore != (int *)0x0) {
          operator_delete__(local_a8.super_TPZVec<int>.fStore);
        }
      }
      TPZManVector<int,_10>::~TPZManVector(&local_78);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule() [TGeometry = pzgeom::TPZGeoLinear]"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
             ,0x454);
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeIntegrationRule()
{
    if (fElementVec.NElements() == 0) {
        DebugStop(); // This case should be treated before
    }
    
    auto basemat = this->Material();
    auto *material =
        dynamic_cast<TPZMatCombinedSpaces*>(basemat);
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        DebugStop();
    }
    
    const int64_t nref = fElementVec.size();
    TPZGeoEl *gel = this->Reference();
    int dim = gel->Dimension();
    TPZStack<int> ordervec;
    for (int64_t iref=0;  iref<nref; iref++)
    {
        if(fActiveApproxSpace[iref] == 0){
            continue;
        }
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(msp)
        {
            ordervec.Push(msp->MaxOrder());
        }
    }
    int order = material->IntegrationRuleOrder(ordervec);
    TPZManVector<int,3> orderdim(dim,order);
    fIntRule.SetOrder(orderdim);
    
}